

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnm.hpp
# Opt level: O3

void __thiscall baryonyx::pnm_vector::~pnm_vector(pnm_vector *this)

{
  long lVar1;
  _Head_base<0UL,_unsigned_char_*,_false> _Var2;
  undefined8 uVar3;
  pointer *__ptr;
  
  if (0 < this->m_heigth) {
    do {
      std::ostream::write((char *)&this->m_ofs,
                          (long)(this->m_buffer)._M_t.
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
      lVar1 = this->m_heigth;
      this->m_heigth = lVar1 + -1;
    } while (1 < lVar1);
  }
  uVar3 = _log;
  lVar1 = _VTT;
  *(long *)&this->m_ofs = _VTT;
  *(undefined8 *)(&this->m_ofs + *(long *)(lVar1 + -0x18)) = uVar3;
  std::filebuf::~filebuf((filebuf *)&this->field_0x10);
  std::ios_base::~ios_base((ios_base *)&this->field_0x100);
  _Var2._M_head_impl =
       (this->m_buffer)._M_t.
       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
       super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  if (_Var2._M_head_impl != (uchar *)0x0) {
    operator_delete__(_Var2._M_head_impl);
  }
  (this->m_buffer)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  return;
}

Assistant:

~pnm_vector()
    {
        for (; m_heigth > 0; --m_heigth)
            m_ofs.write(reinterpret_cast<char*>(m_buffer.get()), size());
    }